

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O2

double __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::Compute_Cq_q
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this)

{
  double dVar1;
  Scalar SVar2;
  Product<Eigen::Matrix<double,_1,_6,_1,_1,_6>,_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  local_40;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_30 [24];
  
  dVar1 = 0.0;
  if (this->variables_1->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_30,this->variables_1);
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,1,6,1,1,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,6,1,1,6>> *)&this->Cq_1,local_30);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_40);
    dVar1 = SVar2 + 0.0;
  }
  if (this->variables_2->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_30,this->variables_2);
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,1,6,1,1,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,6,1,1,6>> *)&this->Cq_2,local_30);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_40);
    dVar1 = dVar1 + SVar2;
  }
  if (this->variables_3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)local_30,this->variables_3);
    local_40 = Eigen::MatrixBase<Eigen::Matrix<double,1,6,1,1,6>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,1,6,1,1,6>> *)&this->Cq_3,local_30);
    SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_40);
    dVar1 = dVar1 + SVar2;
  }
  return dVar1;
}

Assistant:

double Compute_Cq_q() {
        double ret = 0;

        if (variables_1->IsActive()) {
            ret += Cq_1 * variables_1->Get_qb();
        }

        if (variables_2->IsActive()) {
            ret += Cq_2 * variables_2->Get_qb();
        }

        if (variables_3->IsActive()) {
            ret += Cq_3 * variables_3->Get_qb();
        }

        return ret;
    }